

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProperties.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderPropertiesProgramObject::iterate
          (TessellationShaderPropertiesProgramObject *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_8c8;
  MessageBuilder local_748;
  MessageBuilder local_5c8;
  MessageBuilder local_448;
  MessageBuilder local_2c8;
  GLenum local_148;
  GLenum local_144;
  GLint gen_point_mode_value;
  GLint gen_vertex_order_value;
  GLint gen_spacing_value;
  GLint gen_mode_value;
  GLint control_output_vertices_value;
  GLint link_status;
  GLint te_compile_status;
  GLint tc_compile_status;
  _test_descriptor *test;
  __normal_iterator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_*,_std::vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>_>
  local_118;
  __normal_iterator<const_glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_*,_std::vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>_>
  local_110;
  _tests_const_iterator test_iterator;
  _tests tests;
  _test_descriptor test_4;
  _test_descriptor test_3;
  _test_descriptor test_2;
  _test_descriptor test_1;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  TessellationShaderPropertiesProgramObject *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Tessellation shader functionality not supported, skipping",
               &local_39);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  _test_descriptor::_test_descriptor((_test_descriptor *)&test_2.te_body);
  test_2.te_body._0_4_ = 4;
  test_2.te_body._4_4_ = (this->super_TestCaseBase).m_glExtTokens.QUADS;
  _test_descriptor::_test_descriptor((_test_descriptor *)&test_3.te_body);
  test_3.te_body._0_4_ = 0x10;
  test_3.te_body._4_4_ = (this->super_TestCaseBase).m_glExtTokens.ISOLINES;
  test_2.expected_control_output_vertices_value = 0;
  test_2.expected_gen_mode_value = (this->super_TestCaseBase).m_glExtTokens.FRACTIONAL_EVEN;
  test_2.expected_gen_point_mode_value = 0x900;
  test_2._16_8_ = anon_var_dwarf_7e6dfd;
  test_2.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(isolines, fractional_even_spacing, cw) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  _test_descriptor::_test_descriptor((_test_descriptor *)&test_4.te_body);
  test_4.te_body._0_4_ = 0x20;
  test_4.te_body._4_4_ = 4;
  test_3.expected_control_output_vertices_value = 1;
  test_3.expected_gen_mode_value = (this->super_TestCaseBase).m_glExtTokens.FRACTIONAL_ODD;
  test_3.expected_gen_point_mode_value = 0x901;
  test_3._16_8_ = anon_var_dwarf_7e6e2b;
  test_3.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(triangles, fractional_odd_spacing, ccw, point_mode) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)
             &tests.
              super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tests.
  super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
  tests.
  super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (this->super_TestCaseBase).m_glExtTokens.QUADS;
  test_4.expected_control_output_vertices_value = 1;
  test_4.expected_gen_mode_value = 0x202;
  test_4.expected_gen_point_mode_value = 0x901;
  test_4._16_8_ = anon_var_dwarf_7e6e41;
  test_4.tc_body =
       "${VERSION}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(quads, equal_spacing, ccw, point_mode) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
  ;
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::vector((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
            *)&test_iterator);
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::push_back((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
               *)&test_iterator,(value_type *)&test_2.te_body);
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::push_back((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
               *)&test_iterator,(value_type *)&test_3.te_body);
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::push_back((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
               *)&test_iterator,(value_type *)&test_4.te_body);
  std::
  vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
  ::push_back((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
               *)&test_iterator,
              (value_type *)
              &tests.
               super__Vector_base<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_118._M_current =
       (_test_descriptor *)
       std::
       vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
       ::begin((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
                *)&test_iterator);
  __gnu_cxx::
  __normal_iterator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_const*,std::vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>>
  ::__normal_iterator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor*>
            ((__normal_iterator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_const*,std::vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>>>
              *)&local_110,&local_118);
  while( true ) {
    test = (_test_descriptor *)
           std::
           vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
           ::end((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
                  *)&test_iterator);
    bVar1 = __gnu_cxx::operator!=
                      (&local_110,
                       (__normal_iterator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_*,_std::vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>_>
                        *)&test);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      std::
      vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
      ::~vector((vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>
                 *)&test_iterator);
      return STOP;
    }
    _te_compile_status =
         __gnu_cxx::
         __normal_iterator<const_glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_*,_std::vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>_>
         ::operator*(&local_110);
    TestCaseBase::shaderSourceSpecialized
              (&this->super_TestCaseBase,this->m_tc_id,1,&_te_compile_status->tc_body);
    TestCaseBase::shaderSourceSpecialized
              (&this->super_TestCaseBase,this->m_te_id,1,&_te_compile_status->te_body);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glShaderSource() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x19e);
    (**(code **)(local_18 + 0x248))(this->m_tc_id);
    (**(code **)(local_18 + 0x248))(this->m_te_id);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glCompileShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1a4);
    link_status = 0;
    control_output_vertices_value = 0;
    (**(code **)(local_18 + 0xa70))(this->m_tc_id,0x8b81,&link_status);
    (**(code **)(local_18 + 0xa70))(this->m_te_id,0x8b81,&control_output_vertices_value);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1ad);
    if (link_status != 1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Could not compile tessellation control shader",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1b1);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (control_output_vertices_value != 1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Could not compile tessellation evaluation shader",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1b6);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    gen_mode_value = 0;
    (**(code **)(local_18 + 0xce8))(this->m_po_id);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glLinkProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1bd);
    (**(code **)(local_18 + 0x9d8))(this->m_po_id,0x8b82,&gen_mode_value);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1c0);
    if (gen_mode_value != 1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1c4);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    gen_spacing_value = 0;
    gen_vertex_order_value = 0;
    gen_point_mode_value = 0;
    local_144 = 0;
    local_148 = 0;
    (**(code **)(local_18 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_OUTPUT_VERTICES,
               &gen_spacing_value);
    (**(code **)(local_18 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_MODE,
               &gen_vertex_order_value);
    (**(code **)(local_18 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_SPACING,
               &gen_point_mode_value);
    (**(code **)(local_18 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_POINT_MODE,&local_148
              );
    (**(code **)(local_18 + 0x9d8))
              (this->m_po_id,(this->super_TestCaseBase).m_glExtTokens.TESS_GEN_VERTEX_ORDER,
               &local_144);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() for tessellation-specific properties failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x1d4);
    if (gen_spacing_value != _te_compile_status->expected_control_output_vertices_value) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_2c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_2c8,
                          (char (*) [74])
                          "Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property; "
                         );
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b39b84);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,&_te_compile_status->expected_control_output_vertices_value);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])", retrieved: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&gen_spacing_value);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2c8);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1dd);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (gen_vertex_order_value != _te_compile_status->expected_gen_mode_value) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_448,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_448,
                          (char (*) [59])
                          "Invalid value reported for GL_TESS_GEN_MODE_EXT property; ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b39b84);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_te_compile_status->expected_gen_mode_value);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])", retrieved: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&gen_vertex_order_value);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_448);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid value reported for GL_TESS_GEN_MODE_EXT property.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1e6);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (gen_point_mode_value != _te_compile_status->expected_gen_spacing_value) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_5c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_5c8,
                          (char (*) [62])
                          "Invalid value reported for GL_TESS_GEN_SPACING_EXT property; ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b39b84);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,&_te_compile_status->expected_gen_spacing_value);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])", retrieved: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&gen_point_mode_value);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_5c8);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid value reported for GL_TESS_GEN_SPACING_EXT property.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x1f0);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (local_148 != _te_compile_status->expected_gen_point_mode_value) break;
    if (local_144 != _te_compile_status->expected_gen_vertex_order_value) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_8c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_8c8,
                          (char (*) [67])
                          "Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property; ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b39b84);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,&_te_compile_status->expected_gen_vertex_order_value);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])", retrieved: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_144);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8c8);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x204);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    __gnu_cxx::
    __normal_iterator<const_glcts::TessellationShaderPropertiesProgramObject::_test_descriptor_*,_std::vector<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor,_std::allocator<glcts::TessellationShaderPropertiesProgramObject::_test_descriptor>_>_>
    ::operator++(&local_110,0);
  }
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_748,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_748,
                      (char (*) [65])
                      "Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property; ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2b39b84);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,&_te_compile_status->expected_gen_point_mode_value);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])", retrieved: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_148);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_748);
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
             ,0x1fa);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPropertiesProgramObject::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	initTest();

	/* Test 1: Default values. Values as per spec, define as little qualifiers as possible */
	_test_descriptor test_1;

	test_1.expected_control_output_vertices_value = 4;
	test_1.expected_gen_mode_value				  = m_glExtTokens.QUADS;
	test_1.expected_gen_point_mode_value		  = GL_FALSE;
	test_1.expected_gen_spacing_value			  = GL_EQUAL;
	test_1.expected_gen_vertex_order_value		  = GL_CCW;
	test_1.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=4) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_1.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(quads) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 2: 16 vertices per patch + isolines + fractional_even_spacing + cw combination */
	_test_descriptor test_2;

	test_2.expected_control_output_vertices_value = 16;
	test_2.expected_gen_mode_value				  = m_glExtTokens.ISOLINES;
	test_2.expected_gen_point_mode_value		  = GL_FALSE;
	test_2.expected_gen_spacing_value			  = m_glExtTokens.FRACTIONAL_EVEN;
	test_2.expected_gen_vertex_order_value		  = GL_CW;
	test_2.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=16) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_2.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(isolines, fractional_even_spacing, cw) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 3: 32 vertices per patch + triangles + fractional_odd_spacing + ccw combination + point mode*/
	_test_descriptor test_3;

	test_3.expected_control_output_vertices_value = 32;
	test_3.expected_gen_mode_value				  = GL_TRIANGLES;
	test_3.expected_gen_point_mode_value		  = GL_TRUE;
	test_3.expected_gen_spacing_value			  = m_glExtTokens.FRACTIONAL_ODD;
	test_3.expected_gen_vertex_order_value		  = GL_CCW;
	test_3.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=32) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_3.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(triangles, fractional_odd_spacing, ccw, point_mode) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Test 4: 8 vertices per patch + quads + equal_spacing + ccw combination + point mode*/
	_test_descriptor test_4;

	test_4.expected_control_output_vertices_value = 8;
	test_4.expected_gen_mode_value				  = m_glExtTokens.QUADS;
	test_4.expected_gen_point_mode_value		  = GL_TRUE;
	test_4.expected_gen_spacing_value			  = GL_EQUAL;
	test_4.expected_gen_vertex_order_value		  = GL_CCW;
	test_4.tc_body								  = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(vertices=8) out;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					 "}\n";
	test_4.te_body = "${VERSION}\n"
					 "${TESSELLATION_SHADER_REQUIRE}\n"
					 "\n"
					 "layout(quads, equal_spacing, ccw, point_mode) in;\n"
					 "\n"
					 "void main()\n"
					 "{\n"
					 "    gl_Position = gl_in[0].gl_Position;\n"
					 "}\n";

	/* Store all tests in a single vector */
	_tests tests;

	tests.push_back(test_1);
	tests.push_back(test_2);
	tests.push_back(test_3);
	tests.push_back(test_4);

	/* Iterate through all the tests and verify the values reported */
	for (_tests_const_iterator test_iterator = tests.begin(); test_iterator != tests.end(); test_iterator++)
	{
		const _test_descriptor& test = *test_iterator;

		/* Set tessellation control & evaluation shader bodies. */
		shaderSourceSpecialized(m_tc_id, 1 /* count */, &test.tc_body);
		shaderSourceSpecialized(m_te_id, 1 /* count */, &test.te_body);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed");

		/* Compile the shaders */
		gl.compileShader(m_tc_id);
		gl.compileShader(m_te_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

		/* Make sure the shaders compiled */
		glw::GLint tc_compile_status = GL_FALSE;
		glw::GLint te_compile_status = GL_FALSE;

		gl.getShaderiv(m_tc_id, GL_COMPILE_STATUS, &tc_compile_status);
		gl.getShaderiv(m_te_id, GL_COMPILE_STATUS, &te_compile_status);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

		if (tc_compile_status != GL_TRUE)
		{
			TCU_FAIL("Could not compile tessellation control shader");
		}

		if (te_compile_status != GL_TRUE)
		{
			TCU_FAIL("Could not compile tessellation evaluation shader");
		}

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

		if (link_status != GL_TRUE)
		{
			TCU_FAIL("Program linking failed");
		}

		/* Query the tessellation properties of the program object and make sure
		 * the values reported are valid */
		glw::GLint control_output_vertices_value = 0;
		glw::GLint gen_mode_value				 = GL_NONE;
		glw::GLint gen_spacing_value			 = GL_NONE;
		glw::GLint gen_vertex_order_value		 = GL_NONE;
		glw::GLint gen_point_mode_value			 = GL_NONE;

		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_CONTROL_OUTPUT_VERTICES, &control_output_vertices_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_MODE, &gen_mode_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_SPACING, &gen_spacing_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_POINT_MODE, &gen_point_mode_value);
		gl.getProgramiv(m_po_id, m_glExtTokens.TESS_GEN_VERTEX_ORDER, &gen_vertex_order_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() for tessellation-specific properties failed.");

		if (control_output_vertices_value != test.expected_control_output_vertices_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property; "
							   << " expected: " << test.expected_control_output_vertices_value
							   << ", retrieved: " << control_output_vertices_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_CONTROL_OUTPUT_VERTICES_EXT property.");
		}

		if ((glw::GLuint)gen_mode_value != test.expected_gen_mode_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported for GL_TESS_GEN_MODE_EXT property; "
							   << " expected: " << test.expected_gen_mode_value << ", retrieved: " << gen_mode_value
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_MODE_EXT property.");
		}

		if ((glw::GLuint)gen_spacing_value != test.expected_gen_spacing_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_SPACING_EXT property; "
							   << " expected: " << test.expected_gen_spacing_value
							   << ", retrieved: " << gen_spacing_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_SPACING_EXT property.");
		}

		if ((glw::GLuint)gen_point_mode_value != test.expected_gen_point_mode_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property; "
							   << " expected: " << test.expected_gen_point_mode_value
							   << ", retrieved: " << gen_point_mode_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_POINT_MODE_EXT property.");
		}

		if ((glw::GLuint)gen_vertex_order_value != test.expected_gen_vertex_order_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property; "
							   << " expected: " << test.expected_gen_vertex_order_value
							   << ", retrieved: " << gen_vertex_order_value << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported for GL_TESS_GEN_VERTEX_ORDER_EXT property.");
		}
	} /* for (all test descriptors) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}